

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O0

void __thiscall absl::lts_20250127::substitute_internal::Arg::Arg(Arg *this,Dec dec)

{
  undefined1 auVar1 [16];
  uint64_t uVar2;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  byte local_51;
  long lStack_50;
  bool add_sign_again;
  ptrdiff_t fillers;
  Arg *pAStack_40;
  bool neg;
  uint64_t value;
  char *writer;
  char *minfill;
  char *end;
  Arg *this_local;
  Dec dec_local;
  
  dec_local.value = dec._8_8_;
  this_local = (Arg *)dec.value;
  end = (char *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->piece_);
  if (0x20 < (byte)dec_local.value) {
    __assert_fail("dec.width <= numbers_internal::kFastToBufferSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/substitute.cc"
                  ,0x9a,"absl::substitute_internal::Arg::Arg(Dec)");
  }
  minfill = (char *)(this + 1);
  writer = (char *)((long)minfill - (long)(int)(uint)(byte)dec_local.value);
  fillers._7_1_ = dec_local.value._2_1_ & 1;
  value = (uint64_t)minfill;
  for (pAStack_40 = this_local; (Arg *)0x9 < pAStack_40;
      pAStack_40 = (Arg *)((ulong)pAStack_40 / 10)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pAStack_40;
    *(char *)(value - 1) = SUB161(auVar1 % ZEXT816(10),0) + '0';
    value = value - 1;
  }
  *(char *)(value - 1) = (char)pAStack_40 + '0';
  uVar2 = value - 1;
  if ((dec_local.value & 0x10000) != 0) {
    *(undefined1 *)(value - 2) = 0x2d;
    uVar2 = value - 2;
  }
  value = uVar2;
  lStack_50 = value - (long)writer;
  if (0 < lStack_50) {
    local_51 = 0;
    if (((dec_local.value & 0x10000) != 0) && (dec_local.value._1_1_ == '0')) {
      value = value + 1;
      local_51 = 1;
    }
    value = value - lStack_50;
    std::fill_n<char*,long,char>((char *)value,lStack_50,(char *)((long)&dec_local.value + 1));
    if ((local_51 & 1) != 0) {
      *(undefined1 *)(value - 1) = 0x2d;
      value = value - 1;
    }
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_68,(char *)value,(long)minfill - value);
  (this->piece_)._M_len = local_68._M_len;
  (this->piece_)._M_str = local_68._M_str;
  return;
}

Assistant:

Arg::Arg(Dec dec) {
  assert(dec.width <= numbers_internal::kFastToBufferSize);
  char* const end = &scratch_[numbers_internal::kFastToBufferSize];
  char* const minfill = end - dec.width;
  char* writer = end;
  uint64_t value = dec.value;
  bool neg = dec.neg;
  while (value > 9) {
    *--writer = '0' + (value % 10);
    value /= 10;
  }
  *--writer = '0' + static_cast<char>(value);
  if (neg) *--writer = '-';

  ptrdiff_t fillers = writer - minfill;
  if (fillers > 0) {
    // Tricky: if the fill character is ' ', then it's <fill><+/-><digits>
    // But...: if the fill character is '0', then it's <+/-><fill><digits>
    bool add_sign_again = false;
    if (neg && dec.fill == '0') {  // If filling with '0',
      ++writer;                    // ignore the sign we just added
      add_sign_again = true;       // and re-add the sign later.
    }
    writer -= fillers;
    std::fill_n(writer, fillers, dec.fill);
    if (add_sign_again) *--writer = '-';
  }

  piece_ = absl::string_view(writer, static_cast<size_t>(end - writer));
}